

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O2

bool ApprovalTests::CommandReporter::exists(string *command)

{
  bool bVar1;
  int iVar2;
  string which;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = SystemUtils::isWindowsOs();
  if (!bVar1) {
    ::std::operator+(&local_38,"which ",command);
    ::std::operator+(&local_58,&local_38," > /dev/null 2>&1");
    ::std::__cxx11::string::~string((string *)&local_38);
    iVar2 = system(local_58._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_58);
    if (iVar2 == 0) {
      return true;
    }
  }
  bVar1 = FileUtils::fileExists(command);
  return bVar1;
}

Assistant:

bool CommandReporter::exists(const std::string& command)
    {
        bool foundByWhich = false;
        if (!SystemUtils::isWindowsOs())
        {
            std::string which = "which " + command + " > /dev/null 2>&1";
            int result = system(which.c_str());
            foundByWhich = (result == 0);
        }
        return foundByWhich || FileUtils::fileExists(command);
    }